

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O0

void uncreate_artifacts(chunk_conflict *c)

{
  loc_conflict grid_00;
  object *local_28;
  object *obj;
  loc grid;
  wchar_t x;
  wchar_t y;
  chunk_conflict *c_local;
  
  for (grid.y = 0; grid.y < c->height; grid.y = grid.y + 1) {
    for (grid.x = 0; grid.x < c->width; grid.x = grid.x + 1) {
      grid_00 = (loc_conflict)loc(grid.x,grid.y);
      for (local_28 = square_object((chunk *)c,grid_00); local_28 != (object *)0x0;
          local_28 = local_28->next) {
        if (local_28->artifact != (artifact *)0x0) {
          mark_artifact_created(local_28->artifact,false);
        }
      }
    }
  }
  return;
}

Assistant:

void uncreate_artifacts(struct chunk *c)
{
	int y, x;

	/* Also mark created artifacts as not created ... */
	for (y = 0; y < c->height; y++) {
		for (x = 0; x < c->width; x++) {
			struct loc grid = loc(x, y);
			struct object *obj = square_object(c, grid);
			while (obj) {
				if (obj->artifact) {
					mark_artifact_created(obj->artifact, false);
				}
				obj = obj->next;
			}
		}
	}
}